

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglibnetworkinformationbackend.cpp
# Opt level: O2

QLoggingCategory * lcNetInfoGlib(void)

{
  int iVar1;
  
  if ((lcNetInfoGlib()::category == '\0') &&
     (iVar1 = __cxa_guard_acquire(&lcNetInfoGlib()::category), iVar1 != 0)) {
    QLoggingCategory::QLoggingCategory(&lcNetInfoGlib::category,"qt.network.info.glib",QtDebugMsg);
    __cxa_atexit(QLoggingCategory::~QLoggingCategory,&lcNetInfoGlib::category,&__dso_handle);
    __cxa_guard_release(&lcNetInfoGlib()::category);
  }
  return &lcNetInfoGlib::category;
}

Assistant:

QNetworkInformation::Reachability reachabilityFromGNetworkConnectivity(GNetworkConnectivity connectivity)
{
    switch (connectivity) {
    case G_NETWORK_CONNECTIVITY_LOCAL:
        return QNetworkInformation::Reachability::Disconnected;
    case G_NETWORK_CONNECTIVITY_LIMITED:
    case G_NETWORK_CONNECTIVITY_PORTAL:
        return QNetworkInformation::Reachability::Site;
    case G_NETWORK_CONNECTIVITY_FULL:
        return QNetworkInformation::Reachability::Online;
    }
    return QNetworkInformation::Reachability::Unknown;
}